

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

char * __thiscall
Memory::Recycler::LargeAlloc<true>
          (Recycler *this,HeapInfo *heap,size_t size,ObjectInfoBits attributes)

{
  size_t *psVar1;
  undefined4 *puVar2;
  code *pcVar3;
  bool bVar4;
  char *pcVar5;
  undefined6 in_register_0000000a;
  undefined8 *in_FS_OFFSET;
  
  if (0x3ff < (uint)CONCAT62(in_register_0000000a,attributes)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x54f,"((attributes & InternalObjectInfoBitMask) == attributes)",
                       "(attributes & InternalObjectInfoBitMask) == attributes");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar2 = 0;
  }
  if (size < (ulong)((long)this->recyclerFlagsTable->MaxSingleAllocSizeInMB * 0x100000)) {
    pcVar5 = TryLargeAlloc(this,heap,size,attributes,true);
    if (pcVar5 == (char *)0x0) {
      CollectNow<(Memory::CollectionFlags)16384>(this);
      pcVar5 = TryLargeAlloc(this,heap,size,attributes,true);
      if (pcVar5 == (char *)0x0) goto LAB_0027b452;
    }
    psVar1 = &(this->autoHeap).uncollectedAllocBytes;
    *psVar1 = *psVar1 + size;
  }
  else {
LAB_0027b452:
    pcVar5 = (char *)0x0;
  }
  return pcVar5;
}

Assistant:

char*
Recycler::LargeAlloc(HeapInfo* heap, size_t size, ObjectInfoBits attributes)
{
    Assert((attributes & InternalObjectInfoBitMask) == attributes);

#if ENABLE_DEBUG_CONFIG_OPTIONS
    size_t limit = (size_t)GetRecyclerFlagsTable().MaxSingleAllocSizeInMB * 1024 * 1024;
#else
    size_t limit = (size_t)CONFIG_FLAG(MaxSingleAllocSizeInMB) * 1024 * 1024;
#endif

    if (size >= limit)
    {
        if (nothrow == false)
        {
#if ENABLE_DEBUG_CONFIG_OPTIONS
            if (GetRecyclerFlagsTable().EnableFatalErrorOnOOM)
            {
                if (this->IsMemProtectMode())
                {
                    MemGCSingleAllocationLimit_unrecoverable_error();
                }
                else
                {
                    RecyclerSingleAllocationLimit_unrecoverable_error();
                }
            }
#endif
            this->OutOfMemory();
        }
        else
        {
            return nullptr;
        }
    }

    char * addr = TryLargeAlloc(heap, size, attributes, nothrow);
    if (addr == nullptr)
    {
        // Force a collection and try to allocate again.
        this->CollectNow<CollectNowForceInThread>();
        addr = TryLargeAlloc(heap, size, attributes, nothrow);
        if (addr == nullptr)
        {
            if (nothrow == false)
            {
                // Still fails, we are out of memory
                // Since nothrow is false, it's okay to throw here
                this->OutOfMemory();
            }
            else
            {
                return nullptr;
            }
        }
    }
    autoHeap.uncollectedAllocBytes += size;
    return addr;
}